

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::FindHelper<long>
          (pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,long *k,TreeIterator *it)

{
  ulong uVar1;
  void **ppvVar2;
  LogMessage *other;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Base_ptr p_Var6;
  Node *pNVar7;
  TreeIterator tree_it;
  uint uVar8;
  LogFinisher local_71;
  Node *local_70;
  LogMessage local_68;
  unsigned_long index;
  
  uVar1 = *k;
  uVar8 = (uint)((this->seed_ ^ uVar1) * -0x61c8864680b583eb >> 0x20) & (int)this->num_buckets_ - 1U
  ;
  index = (unsigned_long)uVar8;
  ppvVar2 = this->table_;
  pNVar7 = (Node *)ppvVar2[index];
  if (pNVar7 != (Node *)0x0) {
    uVar5 = index ^ 1;
    if (pNVar7 == (Node *)ppvVar2[uVar5]) {
      if ((pNVar7 != (Node *)0x0) && (pNVar7 == (Node *)ppvVar2[uVar5])) {
        if (pNVar7 != (Node *)ppvVar2[uVar5]) {
          local_70 = (Node *)ppvVar2[uVar5];
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x314);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
          internal::LogFinisher::operator=(&local_71,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        index = (unsigned_long)(uVar8 & 0xfffffffe);
        p_Var6 = *(_Base_ptr *)((long)this->table_[index] + 0x18);
        p_Var3 = (_Base_ptr)((long)this->table_[index] + 0x10);
        p_Var4 = p_Var3;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (*k <= *(long *)(p_Var6 + 1)) {
              p_Var4 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < *k];
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        tree_it._M_node = p_Var3;
        if ((p_Var4 != p_Var3) && (tree_it._M_node = p_Var4, *k < *(long *)(p_Var4 + 1))) {
          tree_it._M_node = p_Var3;
        }
        if (tree_it._M_node != p_Var3) {
          if (it != (TreeIterator *)0x0) {
            it->_M_node = (_Base_ptr)tree_it;
          }
          iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::iterator_base(&__return_storage_ptr__->first,tree_it,this,index);
          goto LAB_00210ac7;
        }
      }
    }
    else {
      do {
        uVar5 = *(ulong *)pNVar7;
        if (uVar5 == uVar1) {
          (__return_storage_ptr__->first).node_ = pNVar7;
          (__return_storage_ptr__->first).m_ = this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          __return_storage_ptr__->second = index;
          break;
        }
        pNVar7 = pNVar7->next;
      } while (pNVar7 != (Node *)0x0);
      if (uVar5 == uVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_00210ac7:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }